

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness-traversal.h
# Opt level: O0

bool __thiscall
wasm::LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::mergeStartsAndCheckChange
          (LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *this,
          vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
          *blocks,SetOfLocals *old,SetOfLocals *ret)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar1;
  reference ppBVar2;
  ulong uVar3;
  SortedVector local_50;
  uint local_34;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_30;
  Index i;
  SetOfLocals *ret_local;
  SetOfLocals *old_local;
  vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  *blocks_local;
  LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *this_local;
  
  pvStack_30 = &ret->super_vector<unsigned_int,_std::allocator<unsigned_int>_>;
  ret_local = old;
  old_local = (SetOfLocals *)blocks;
  blocks_local = (vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                  *)this;
  sVar1 = std::
          vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
          ::size(blocks);
  if (sVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    ppBVar2 = std::
              vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
              ::operator[]((vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)old_local,0);
    SortedVector::operator=((SortedVector *)pvStack_30,(SortedVector *)*ppBVar2);
    sVar1 = std::
            vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
            ::size((vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                    *)old_local);
    if (1 < sVar1) {
      for (local_34 = 1; uVar3 = (ulong)local_34,
          sVar1 = std::
                  vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                  ::size((vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                          *)old_local), this_00 = pvStack_30, uVar3 < sVar1; local_34 = local_34 + 1
          ) {
        ppBVar2 = std::
                  vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                  ::operator[]((vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                                *)old_local,(ulong)local_34);
        SortedVector::merge(&local_50,(SortedVector *)this_00,(SortedVector *)*ppBVar2);
        SortedVector::operator=((SortedVector *)pvStack_30,&local_50);
        SortedVector::~SortedVector(&local_50);
      }
    }
    this_local._7_1_ =
         std::operator!=(&ret_local->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
                         pvStack_30);
  }
  return this_local._7_1_;
}

Assistant:

bool mergeStartsAndCheckChange(std::vector<BasicBlock*>& blocks,
                                 SetOfLocals& old,
                                 SetOfLocals& ret) {
    if (blocks.size() == 0) {
      return false;
    }
    ret = blocks[0]->contents.start;
    if (blocks.size() > 1) {
      // more than one, so we must merge
      for (Index i = 1; i < blocks.size(); i++) {
        ret = ret.merge(blocks[i]->contents.start);
      }
    }
    return old != ret;
  }